

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::quantize(FastText *this,Args *qargs)

{
  real rVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  element_type *peVar3;
  invalid_argument *this_00;
  FastText *pFVar4;
  size_type sVar5;
  real *prVar6;
  element_type *peVar7;
  Dictionary *in_RSI;
  long in_RDI;
  Model *pMVar8;
  int j;
  int i;
  shared_ptr<fasttext::Matrix> ninput;
  vector<int,_std::allocator<int>_> idx;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffe68;
  Model *in_stack_fffffffffffffe70;
  Matrix *in_stack_fffffffffffffe78;
  undefined1 qout;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe80;
  vector<long,_std::allocator<long>_> *this_01;
  undefined7 in_stack_fffffffffffffe88;
  byte bVar9;
  int *in_stack_fffffffffffffe90;
  bool *in_stack_fffffffffffffe98;
  unsigned_long *in_stack_fffffffffffffea0;
  Matrix *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb4;
  int iVar10;
  entry_type type;
  Dictionary *in_stack_fffffffffffffeb8;
  FastText *this_02;
  int32_t in_stack_ffffffffffffff44;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff48;
  int local_58;
  int local_54;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffe8;
  Dictionary *this_03;
  
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x17554c);
  if (peVar3->model != sup) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"For now we only support quantization of supervised models");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  this_03 = in_RSI;
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1755d9);
  std::__cxx11::string::operator=((string *)peVar3,(string *)in_RSI);
  bVar9 = *(byte *)((long)&this_03[1].size_ + 1);
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x17560b);
  peVar3->qout = (bool)(bVar9 & 1);
  pvVar2 = &this_03->word2int_;
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x17563c);
  std::__cxx11::string::operator=
            ((string *)&peVar3->output,
             (string *)
             &(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  type = (entry_type)((uint)in_stack_fffffffffffffeb4 >> 0x18);
  if (*(long *)&this_03[1].nlabels_ != 0) {
    this_02 = *(FastText **)&this_03[1].nlabels_;
    std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x17568e);
    pFVar4 = (FastText *)Matrix::size(in_stack_fffffffffffffe78,(int64_t)in_stack_fffffffffffffe70);
    type = (entry_type)((uint)in_stack_fffffffffffffeb4 >> 0x18);
    if (this_02 < pFVar4) {
      selectEmbeddings((FastText *)in_stack_ffffffffffffff48._M_pi,in_stack_ffffffffffffff44);
      std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1756ea);
      Dictionary::prune(this_03,in_stack_ffffffffffffffe8);
      std::vector<int,_std::allocator<int>_>::size
                ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffc8);
      std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x17571e);
      std::make_shared<fasttext::Matrix,unsigned_long,int&>
                ((unsigned_long *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      local_54 = 0;
      while( true ) {
        sVar5 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffc8);
        type = (entry_type)((uint)in_stack_fffffffffffffeb4 >> 0x18);
        if (sVar5 <= (ulong)(long)local_54) break;
        local_58 = 0;
        while( true ) {
          peVar3 = std::
                   __shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x17579e);
          if (peVar3->dim <= local_58) break;
          std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1757c2);
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffc8,(long)local_54);
          prVar6 = Matrix::at((Matrix *)in_stack_fffffffffffffe70,(int64_t)in_stack_fffffffffffffe68
                              ,0x1757f1);
          rVar1 = *prVar6;
          std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x175814);
          prVar6 = Matrix::at((Matrix *)in_stack_fffffffffffffe70,(int64_t)in_stack_fffffffffffffe68
                              ,0x17582c);
          *prVar6 = rVar1;
          local_58 = local_58 + 1;
        }
        local_54 = local_54 + 1;
      }
      std::shared_ptr<fasttext::Matrix>::operator=
                (&in_stack_fffffffffffffe70->wi_,
                 (shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffe68);
      if ((this_03[1].size_ & 0x10000) != 0) {
        iVar10 = *(int *)((long)&this_03->nids_ + 4);
        peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1758f9);
        peVar3->epoch = iVar10;
        in_stack_fffffffffffffeb8 = *(Dictionary **)&this_03->nlabels_;
        peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x175920);
        type = (entry_type)((uint)iVar10 >> 0x18);
        peVar3->lr = (double)in_stack_fffffffffffffeb8;
        iVar10 = *(int *)((long)&(this_03->pruneidx_)._M_h._M_element_count + 4);
        peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x17594a);
        peVar3->thread = iVar10;
        iVar10 = *(int *)&this_03[1].words_.
                          super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
        peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x175973);
        peVar3->verbose = iVar10;
        startThreads(this_02);
      }
      std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x17599b);
      std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffe80);
    }
  }
  qout = (undefined1)((ulong)in_stack_fffffffffffffe78 >> 0x38);
  std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffe70);
  std::make_shared<fasttext::QMatrix,fasttext::Matrix&,unsigned_long_const&,bool_const&>
            (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::shared_ptr<fasttext::QMatrix>::operator=
            ((shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffe70,
             (shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffe68);
  std::shared_ptr<fasttext::QMatrix>::~shared_ptr((shared_ptr<fasttext::QMatrix> *)0x175a21);
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x175a2e);
  if ((peVar3->qout & 1U) != 0) {
    std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffe70);
    std::make_shared<fasttext::QMatrix,fasttext::Matrix&,int,bool_const&>
              (in_stack_fffffffffffffea8,(int *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98)
    ;
    std::shared_ptr<fasttext::QMatrix>::operator=
              ((shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffe70,
               (shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffe68);
    std::shared_ptr<fasttext::QMatrix>::~shared_ptr((shared_ptr<fasttext::QMatrix> *)0x175aa0);
  }
  *(undefined1 *)(in_RDI + 0x98) = 1;
  bVar9 = *(byte *)(in_RDI + 0x98);
  pMVar8 = (Model *)(in_RDI + 0x70);
  peVar7 = std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x175ac7);
  peVar7->quant_ = (bool)(bVar9 & 1);
  std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x175ade);
  std::shared_ptr<fasttext::QMatrix>::shared_ptr
            ((shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffe70,
             (shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffe68);
  std::shared_ptr<fasttext::QMatrix>::shared_ptr
            ((shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffe70,
             (shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffe68);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x175b2c);
  Model::setQuantizePointer
            (pMVar8,(shared_ptr<fasttext::QMatrix> *)CONCAT17(bVar9,in_stack_fffffffffffffe88),
             (shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffe80,(bool)qout);
  std::shared_ptr<fasttext::QMatrix>::~shared_ptr((shared_ptr<fasttext::QMatrix> *)0x175b59);
  std::shared_ptr<fasttext::QMatrix>::~shared_ptr((shared_ptr<fasttext::QMatrix> *)0x175b66);
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x175b73);
  if (peVar3->model == sup) {
    std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x175b91);
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x175ba7);
    this_01 = (vector<long,_std::allocator<long>_> *)&stack0xffffffffffffff48;
    Dictionary::getCounts(in_stack_fffffffffffffeb8,type);
    Model::setTargetCounts(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    std::vector<long,_std::allocator<long>_>::~vector(this_01);
  }
  else {
    peVar7 = std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x175c4e);
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x175c63);
    pMVar8 = (Model *)&stack0xffffffffffffff30;
    Dictionary::getCounts(in_stack_fffffffffffffeb8,type);
    Model::setTargetCounts(pMVar8,(vector<long,_std::allocator<long>_> *)peVar7);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffe80);
  }
  return;
}

Assistant:

void FastText::quantize(const Args& qargs) {
	if (args_->model != model_name::sup) {
		throw std::invalid_argument(
				"For now we only support quantization of supervised models");
	}
	args_->input = qargs.input;
	args_->qout = qargs.qout;
	args_->output = qargs.output;

	if (qargs.cutoff > 0 && qargs.cutoff < input_->size(0)) {
		auto idx = selectEmbeddings(qargs.cutoff);
		dict_->prune(idx);
		std::shared_ptr<Matrix> ninput =
				std::make_shared<Matrix>(idx.size(), args_->dim);
		for (auto i = 0; i < idx.size(); i++) {
			for (auto j = 0; j < args_->dim; j++) {
				ninput->at(i, j) = input_->at(idx[i], j);
			}
		}
		input_ = ninput;
		if (qargs.retrain) {
			args_->epoch = qargs.epoch;
			args_->lr = qargs.lr;
			args_->thread = qargs.thread;
			args_->verbose = qargs.verbose;
			startThreads();
		}
	}

	qinput_ = std::make_shared<QMatrix>(*input_, qargs.dsub, qargs.qnorm);

	if (args_->qout) {
		qoutput_ = std::make_shared<QMatrix>(*output_, 2, qargs.qnorm);
	}

	quant_ = true;
	// model_ = std::make_shared<Model>(input_, output_,  0, args_,0);
	model_->quant_ = quant_;
	model_->setQuantizePointer(qinput_, qoutput_, args_->qout);
	if (args_->model == model_name::sup) {
		model_->setTargetCounts(dict_->getCounts(entry_type::label));
	} else {
		model_->setTargetCounts(dict_->getCounts(entry_type::word));
	}
}